

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

ptr<resp_msg> __thiscall nuraft::raft_server::handle_reconnect_req(raft_server *this,req_msg *req)

{
  bool bVar1;
  srv_role sVar2;
  int iVar3;
  element_type *peVar4;
  element_type *this_00;
  element_type *peVar5;
  socklen_t *__addr_len;
  msg_base *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar7;
  ptr<peer> pp;
  iterator entry;
  int32 srv_id;
  ptr<resp_msg> *resp;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_fffffffffffffec8;
  peer *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  msg_type *in_stack_fffffffffffffee0;
  unsigned_long *in_stack_fffffffffffffee8;
  string local_c8 [48];
  string local_98 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_78;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_70;
  undefined4 local_64;
  string local_60 [52];
  undefined4 local_2c;
  ulong local_28;
  byte local_1d;
  uint local_1c;
  
  local_1c = msg_base::get_src(in_RDX);
  local_1d = 0;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x277616);
  local_28 = srv_state::get_term((srv_state *)0x27761e);
  local_2c = 0x1b;
  __addr_len = (socklen_t *)(in_RSI + 0x38);
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int&>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             (int *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (int *)in_stack_fffffffffffffed0);
  sVar2 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x27766d);
  if (sVar2 == leader) {
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::find(in_stack_fffffffffffffec8,(key_type *)0x2777a5);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end(in_stack_fffffffffffffec8);
    bVar1 = std::__detail::operator==(&local_70,&local_78);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      _Var6._M_pi = extraout_RDX_02;
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27781b);
        iVar3 = (**(code **)(*(long *)peVar4 + 0x38))();
        _Var6._M_pi = extraout_RDX_03;
        if (1 < iVar3) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27784b);
          msg_if_given_abi_cxx11_
                    ((char *)local_98,"cannot find peer %d to re-connect",(ulong)local_1c);
          (**(code **)(*(long *)peVar4 + 0x40))
                    (peVar4,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_reconnect_req",0x3af,local_98);
          std::__cxx11::string::~string(local_98);
          _Var6._M_pi = extraout_RDX_04;
        }
      }
      local_1d = 1;
      local_64 = 1;
    }
    else {
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator->
                ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x2778fa);
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffed0,
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffec8);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x27791d);
      peer::schedule_reconnection(in_stack_fffffffffffffed0);
      this_00 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x277931);
      peVar5 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x277947);
      iVar3 = (**(code **)(*(long *)peVar5 + 0x10))();
      resp_msg::accept(this_00,iVar3,__addr,__addr_len);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x277996);
        iVar3 = (**(code **)(*(long *)peVar4 + 0x38))();
        if (3 < iVar3) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2779c6);
          msg_if_given_abi_cxx11_
                    ((char *)local_c8,"re-connection to peer %d scheduled",(ulong)local_1c);
          (**(code **)(*(long *)peVar4 + 0x40))
                    (peVar4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_reconnect_req",0x3b7,local_c8);
          std::__cxx11::string::~string(local_c8);
        }
      }
      local_1d = 1;
      local_64 = 1;
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x277a77);
      _Var6._M_pi = extraout_RDX_05;
    }
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    _Var6._M_pi = extraout_RDX;
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2776a1);
      iVar3 = (**(code **)(*(long *)peVar4 + 0x38))();
      _Var6._M_pi = extraout_RDX_00;
      if (1 < iVar3) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2776d1);
        msg_if_given_abi_cxx11_
                  ((char *)local_60,"this node is not a leader (upon re-connect req from peer %d)",
                   (ulong)local_1c);
        (**(code **)(*(long *)peVar4 + 0x40))
                  (peVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_reconnect_req",0x3a9,local_60);
        std::__cxx11::string::~string(local_60);
        _Var6._M_pi = extraout_RDX_01;
      }
    }
    local_1d = 1;
    local_64 = 1;
  }
  if ((local_1d & 1) == 0) {
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x277a9c);
    _Var6._M_pi = extraout_RDX_06;
  }
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_reconnect_req(req_msg& req) {
    int32 srv_id = req.get_src();
    ptr<resp_msg> resp( cs_new<resp_msg>
                        ( state_->get_term(),
                          msg_type::reconnect_response,
                          id_,
                          srv_id ) );
    if (role_ != srv_role::leader) {
        p_er("this node is not a leader "
             "(upon re-connect req from peer %d)",
             srv_id);
        return resp;
    }

    auto entry = peers_.find(srv_id);
    if (entry == peers_.end()) {
        p_er("cannot find peer %d to re-connect", srv_id);
        return resp;
    }

    // Schedule re-connection.
    ptr<peer> pp = entry->second;
    pp->schedule_reconnection();
    resp->accept(log_store_->next_slot());
    p_in("re-connection to peer %d scheduled", srv_id);

    return resp;
}